

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

UBool utrie_setRange32_63(UNewTrie *trie,UChar32 start,UChar32 limit,uint32_t value,UBool overwrite)

{
  uint32_t initialValue_00;
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int local_38;
  UChar32 nextStart;
  int32_t repeatBlock;
  int32_t rest;
  int32_t block;
  uint32_t initialValue;
  UBool overwrite_local;
  uint32_t value_local;
  UChar32 limit_local;
  UChar32 start_local;
  UNewTrie *trie_local;
  
  if ((((trie == (UNewTrie *)0x0) || (trie->isCompacted != '\0')) || (0x10ffff < (uint)start)) ||
     ((0x110000 < (uint)limit || (limit < start)))) {
    trie_local._7_1_ = '\0';
  }
  else if (start == limit) {
    trie_local._7_1_ = '\x01';
  }
  else {
    initialValue_00 = *trie->data;
    value_local = start;
    if ((start & 0x1fU) != 0) {
      iVar2 = utrie_getDataBlock(trie,start);
      if (iVar2 < 0) {
        return '\0';
      }
      value_local = start + 0x20U & 0xffffffe0;
      if (limit < (int)value_local) {
        utrie_fillBlock(trie->data + iVar2,start & 0x1f,limit & 0x1f,value,initialValue_00,overwrite
                       );
        return '\x01';
      }
      utrie_fillBlock(trie->data + iVar2,start & 0x1f,0x20,value,initialValue_00,overwrite);
    }
    if (value == initialValue_00) {
      local_38 = 0;
    }
    else {
      local_38 = -1;
    }
    for (; (int)value_local < (int)(limit & 0xffffffe0U); value_local = value_local + 0x20) {
      iVar3 = (int)value_local >> 5;
      iVar1 = trie->index[iVar3];
      if (iVar1 < 1) {
        if ((trie->data[-iVar1] != value) && ((iVar1 == 0 || (overwrite != '\0')))) {
          if (local_38 < 0) {
            local_38 = utrie_getDataBlock(trie,value_local);
            if (local_38 < 0) {
              return '\0';
            }
            trie->index[iVar3] = -local_38;
            utrie_fillBlock(trie->data + local_38,0,0x20,value,initialValue_00,'\x01');
          }
          else {
            trie->index[iVar3] = -local_38;
          }
        }
      }
      else {
        utrie_fillBlock(trie->data + iVar1,0,0x20,value,initialValue_00,overwrite);
      }
    }
    if ((limit & 0x1fU) != 0) {
      iVar2 = utrie_getDataBlock(trie,value_local);
      if (iVar2 < 0) {
        return '\0';
      }
      utrie_fillBlock(trie->data + iVar2,0,limit & 0x1fU,value,initialValue_00,overwrite);
    }
    trie_local._7_1_ = '\x01';
  }
  return trie_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_setRange32(UNewTrie *trie, UChar32 start, UChar32 limit, uint32_t value, UBool overwrite) {
    /*
     * repeat value in [start..limit[
     * mark index values for repeat-data blocks by setting bit 31 of the index values
     * fill around existing values if any, if(overwrite)
     */
    uint32_t initialValue;
    int32_t block, rest, repeatBlock;

    /* valid, uncompacted trie and valid indexes? */
    if( trie==NULL || trie->isCompacted ||
        (uint32_t)start>0x10ffff || (uint32_t)limit>0x110000 || start>limit
    ) {
        return FALSE;
    }
    if(start==limit) {
        return TRUE; /* nothing to do */
    }

    initialValue=trie->data[0];
    if(start&UTRIE_MASK) {
        UChar32 nextStart;

        /* set partial block at [start..following block boundary[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        nextStart=(start+UTRIE_DATA_BLOCK_LENGTH)&~UTRIE_MASK;
        if(nextStart<=limit) {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, UTRIE_DATA_BLOCK_LENGTH,
                            value, initialValue, overwrite);
            start=nextStart;
        } else {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, limit&UTRIE_MASK,
                            value, initialValue, overwrite);
            return TRUE;
        }
    }

    /* number of positions in the last, partial block */
    rest=limit&UTRIE_MASK;

    /* round down limit to a block boundary */
    limit&=~UTRIE_MASK;

    /* iterate over all-value blocks */
    if(value==initialValue) {
        repeatBlock=0;
    } else {
        repeatBlock=-1;
    }
    while(start<limit) {
        /* get index value */
        block=trie->index[start>>UTRIE_SHIFT];
        if(block>0) {
            /* already allocated, fill in value */
            utrie_fillBlock(trie->data+block, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, overwrite);
        } else if(trie->data[-block]!=value && (block==0 || overwrite)) {
            /* set the repeatBlock instead of the current block 0 or range block */
            if(repeatBlock>=0) {
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
            } else {
                /* create and set and fill the repeatBlock */
                repeatBlock=utrie_getDataBlock(trie, start);
                if(repeatBlock<0) {
                    return FALSE;
                }

                /* set the negative block number to indicate that it is a repeat block */
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
                utrie_fillBlock(trie->data+repeatBlock, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, TRUE);
            }
        }

        start+=UTRIE_DATA_BLOCK_LENGTH;
    }

    if(rest>0) {
        /* set partial block at [last block boundary..limit[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        utrie_fillBlock(trie->data+block, 0, rest, value, initialValue, overwrite);
    }

    return TRUE;
}